

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  long lVar1;
  xmlChar *pxVar2;
  xmlXPathObjectPtr value;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr pxVar4;
  int iVar5;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 2) {
    if (ctxt->valueNr < 2) {
      iVar5 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
        iVar5 = ctxt->valueNr;
        lVar1 = (long)iVar5;
        if (lVar1 < 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar5 + -1;
          if (iVar5 == 1) {
            pxVar3 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar3 = ctxt->valueTab[lVar1 + -2];
          }
          ctxt->value = pxVar3;
          pxVar3 = ctxt->valueTab[lVar1 + -1];
          ctxt->valueTab[lVar1 + -1] = (xmlXPathObjectPtr)0x0;
        }
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        iVar5 = ctxt->valueNr;
        lVar1 = (long)iVar5;
        if (lVar1 < 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar5 + -1;
          if (iVar5 == 1) {
            pxVar4 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar4 = ctxt->valueTab[lVar1 + -2];
          }
          ctxt->value = pxVar4;
          pxVar4 = ctxt->valueTab[lVar1 + -1];
          ctxt->valueTab[lVar1 + -1] = (xmlXPathObjectPtr)0x0;
        }
        if ((pxVar4 != (xmlXPathObjectPtr)0x0) && (pxVar4->type == XPATH_STRING)) {
          pxVar2 = xmlStrstr(pxVar4->stringval,pxVar3->stringval);
          value = xmlXPathCacheNewBoolean(ctxt,(uint)(pxVar2 != (xmlChar *)0x0));
          xmlXPathValuePush(ctxt,value);
          xmlXPathReleaseObject(ctxt->context,pxVar4);
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          return;
        }
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        xmlXPathReleaseObject(ctxt->context,pxVar3);
      }
      iVar5 = 0xb;
    }
  }
  else {
    iVar5 = 0xc;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathContainsFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr hay, needle;

    CHECK_ARITY(2);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    needle = xmlXPathValuePop(ctxt);
    CAST_TO_STRING;
    hay = xmlXPathValuePop(ctxt);

    if ((hay == NULL) || (hay->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, hay);
	xmlXPathReleaseObject(ctxt->context, needle);
	XP_ERROR(XPATH_INVALID_TYPE);
    }
    if (xmlStrstr(hay->stringval, needle->stringval))
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 1));
    else
	xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, 0));
    xmlXPathReleaseObject(ctxt->context, hay);
    xmlXPathReleaseObject(ctxt->context, needle);
}